

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_bagwell(uchar **strings,size_t n)

{
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *root;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  
  root = (TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  insert<16384u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_bagwell<unsigned_char*,16u>,unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_bagwell(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}